

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  TString *key;
  TValue *slot;
  StkId pSVar1;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    slot = luaH_getstr((Table *)(t->value_).gc,key);
    if ((slot->tt_ & 0xf) != 0) {
      pSVar1 = (L->top).p;
      (pSVar1->val).value_ = slot->value_;
      (pSVar1->val).tt_ = slot->tt_;
      pSVar1 = (StkId)((L->top).offset + 0x10);
      (L->top).p = pSVar1;
      goto LAB_00105069;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = key;
  (pSVar1->val).tt_ = key->tt | 0x40;
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  luaV_finishget(L,t,&pSVar1->val,pSVar1,slot);
  pSVar1 = (StkId)(L->top).offset;
LAB_00105069:
  return *(byte *)((long)pSVar1 + -8) & 0xf;
}

Assistant:

l_sinline int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    setobj2s(L, L->top.p, slot);
    api_incr_top(L);
  }
  else {
    setsvalue2s(L, L->top.p, str);
    api_incr_top(L);
    luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, slot);
  }
  lua_unlock(L);
  return ttype(s2v(L->top.p - 1));
}